

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::copy_make_border_3d
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,int front,int behind,
               int type,float v,Option *opt)

{
  Layer *this;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  undefined8 in_stack_00000020;
  ParamDict pd;
  Layer *padding;
  undefined8 in_stack_ffffffffffffffa8;
  ParamDict *this_00;
  ParamDict *in_stack_ffffffffffffffc0;
  
  this = create_layer((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  this_00 = (ParamDict *)&stack0xffffffffffffffc0;
  ParamDict::ParamDict(in_stack_ffffffffffffffc0);
  ParamDict::set(this_00,0,in_EDX);
  ParamDict::set((ParamDict *)&stack0xffffffffffffffc0,1,in_ECX);
  ParamDict::set((ParamDict *)&stack0xffffffffffffffc0,2,in_R8D);
  ParamDict::set((ParamDict *)&stack0xffffffffffffffc0,3,in_R9D);
  ParamDict::set((ParamDict *)&stack0xffffffffffffffc0,4,in_stack_00000018);
  ParamDict::set((ParamDict *)&stack0xffffffffffffffc0,5,in_XMM0_Da);
  ParamDict::set((ParamDict *)&stack0xffffffffffffffc0,7,in_stack_00000008);
  ParamDict::set((ParamDict *)&stack0xffffffffffffffc0,8,in_stack_00000010);
  (*this->_vptr_Layer[2])(this,&stack0xffffffffffffffc0);
  (*this->_vptr_Layer[4])(this,in_stack_00000020);
  (*this->_vptr_Layer[7])(this,in_RDI,in_RSI,in_stack_00000020);
  (*this->_vptr_Layer[5])(this,in_stack_00000020);
  if (this != (Layer *)0x0) {
    (*this->_vptr_Layer[1])();
  }
  ParamDict::~ParamDict((ParamDict *)this);
  return;
}

Assistant:

void copy_make_border_3d(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int front, int behind, int type, float v, const Option& opt)
{
    Layer* padding = create_layer(LayerType::Padding);

    ParamDict pd;
    pd.set(0, top);
    pd.set(1, bottom);
    pd.set(2, left);
    pd.set(3, right);
    pd.set(4, type);
    pd.set(5, v);
    pd.set(7, front);
    pd.set(8, behind);

    padding->load_param(pd);

    padding->create_pipeline(opt);

    padding->forward(src, dst, opt);

    padding->destroy_pipeline(opt);

    delete padding;
}